

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_set_gama_int(spng_ctx *ctx,uint32_t gamma)

{
  int iVar1;
  
  iVar1 = 1;
  if (((ctx != (spng_ctx *)0x0) &&
      (((ctx->data != (uchar *)0x0 || (iVar1 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
       (iVar1 = read_chunks(ctx,0), iVar1 == 0)))) && (iVar1 = 1, 0 < (int)gamma)) {
    ctx->gama = gamma;
    *(byte *)&ctx->stored = *(byte *)&ctx->stored | 0x10;
    *(byte *)&ctx->user = *(byte *)&ctx->user | 0x10;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int spng_set_gama_int(spng_ctx *ctx, uint32_t gamma)
{
    SPNG_SET_CHUNK_BOILERPLATE(ctx);

    if(!gamma) return 1;
    if(gamma > spng_u32max) return 1;

    ctx->gama = gamma;

    ctx->stored.gama = 1;
    ctx->user.gama = 1;

    return 0;
}